

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O3

void spread_monsters(chunk *c,char *type,wchar_t depth,wchar_t num,wchar_t y0,wchar_t x0,wchar_t dy,
                    wchar_t dx,uint8_t origin)

{
  ushort uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  monster_race *pmVar5;
  loc lVar6;
  loc_conflict grid;
  int iVar7;
  wchar_t y;
  wchar_t x;
  wchar_t local_6c;
  
  uVar1 = c->mon_max;
  _Var2 = mon_restrict(type,depth,c->depth,true);
  if ((!_Var2) || (pmVar5 = get_mon_num(depth,c->depth), pmVar5 == (monster_race *)0x0)) {
    return;
  }
  if (num < L'\x01') {
LAB_0014e30e:
    select_current_level = c->depth;
    allow_unique = true;
    base_d_char = L'\0';
    get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    return;
  }
  iVar4 = 0;
  local_6c = L'\0';
  do {
    if (dx == L'\0' && dy == L'\0') {
      lVar6 = (loc)loc(x0,y0);
      _Var2 = square_in_bounds((chunk_conflict *)c,lVar6);
      y = y0;
      x = x0;
      if (!_Var2) goto LAB_0014e30e;
    }
    else {
      iVar7 = 10;
      while( true ) {
        uVar3 = Rand_div(dy * 2 + 1);
        y = uVar3 + (y0 - dy);
        uVar3 = Rand_div(dx * 2 + 1);
        x = uVar3 + (x0 - dx);
        lVar6 = (loc)loc(x,y);
        _Var2 = square_in_bounds((chunk_conflict *)c,lVar6);
        if (_Var2) break;
        iVar7 = iVar7 + -1;
        if (iVar7 == 0) goto LAB_0014e30e;
      }
    }
    lVar6 = (loc)loc(x,y);
    _Var2 = square_isempty((chunk_conflict *)c,lVar6);
    iVar7 = iVar4;
    if (_Var2) {
      grid = loc(x,y);
      pick_and_place_monster(c,grid,depth,true,true,origin);
      if (num * 2 < (int)((uint)c->mon_max - (uint)uVar1)) goto LAB_0014e30e;
      local_6c = local_6c + L'\x01';
      iVar7 = 0;
    }
    if ((num <= local_6c) || (iVar4 = iVar7 + 1, 0x30 < iVar7)) goto LAB_0014e30e;
  } while( true );
}

Assistant:

void spread_monsters(struct chunk *c, const char *type, int depth, int num, 
		int y0, int x0, int dy, int dx, uint8_t origin)
{
	int i, j;
	int count;
	int y = y0, x = x0;
	int start_mon_num = c->mon_max;

	/* Restrict monsters.  Allow uniques. Leave area empty if none found. */
	if (!mon_restrict(type, depth, c->depth, true))
		return;

	/* Build the monster probability table. */
	if (!get_mon_num(depth, c->depth))
		return;


	/* Try to summon monsters within our rectangle of effect. */
	for (count = 0, i = 0; ((count < num) && (i < 50)); i++) {
		/* Get a location */
		if ((dy == 0) && (dx == 0)) {
			y = y0;
			x = x0;
			if (!square_in_bounds(c, loc(x, y))) {
				(void) mon_restrict(NULL, depth,
					c->depth, true);
				return;
			}
		} else {
			for (j = 0; j < 10; j++) {
				y = rand_spread(y0, dy);
				x = rand_spread(x0, dx);
				if (!square_in_bounds(c, loc(x, y))) {
					if (j < 9) {
						continue;
					} else {
						(void) mon_restrict(NULL, depth,
							c->depth, true);
						return;
					}
				}
				break;
			}
		}

		/* Require "empty" floor grids */
		if (!square_isempty(c, loc(x, y))) continue;

		/* Place the monster (sleeping, allow groups) */
		pick_and_place_monster(c, loc(x, y), depth, true, true, origin);

		/* Rein in monster groups and escorts a little. */
		if (c->mon_max - start_mon_num > num * 2)
			break;

		/* Count the monster(s), reset the loop count */
		count++;
		i = 0;
	}

	/* Remove monster restrictions. */
	(void) mon_restrict(NULL, depth, c->depth, true);
}